

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

Vec_Str_t *
Bmc_CollapseOne_int(sat_solver *pSat,int nVars,int nCubeLim,int nBTLimit,int fCanon,int fReverse,
                   int fVerbose)

{
  char cVar1;
  int iVar2;
  double dVar3;
  size_t sVar4;
  bool bVar5;
  uint *puVar6;
  sat_solver *pSat_00;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  void *pvVar13;
  undefined8 *puVar14;
  Vec_Int_t *p;
  int *piVar15;
  Vec_Int_t *pVVar16;
  Vec_Int_t *vNums;
  Vec_Int_t *vTemp;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint **ppuVar21;
  Vec_Str_t *vSop;
  char *pcVar22;
  undefined4 in_register_00000084;
  uint uVar23;
  uint uVar24;
  int i;
  long lVar25;
  bool bVar26;
  uint local_e4;
  long local_d8;
  long local_c0;
  int fComplete [2];
  int pLits [2];
  Vec_Int_t *local_a8;
  timespec ts;
  uint *local_88 [2];
  sat_solver *local_78;
  ABC_INT64_T local_70;
  ulong local_68;
  undefined8 local_60;
  abctime Time [2] [2];
  
  local_60 = CONCAT44(in_register_00000084,fCanon);
  uVar19 = (ulong)(uint)nVars;
  puVar12 = (uint *)malloc(0x10);
  puVar12[0] = 1000;
  puVar12[1] = 0;
  pvVar13 = malloc(1000);
  *(void **)(puVar12 + 2) = pvVar13;
  local_88[0] = puVar12;
  puVar14 = (undefined8 *)malloc(0x10);
  *puVar14 = 1000;
  pvVar13 = malloc(1000);
  puVar14[1] = pvVar13;
  uVar20 = nVars + 1;
  local_88[1] = (uint *)puVar14;
  p = (Vec_Int_t *)malloc(0x10);
  uVar24 = 0x10;
  if (0xe < (uint)nVars) {
    uVar24 = uVar20;
  }
  p->nSize = 0;
  p->nCap = uVar24;
  lVar25 = (long)(int)uVar24;
  if (uVar24 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar25 * 4);
  }
  p->pArray = piVar15;
  pVVar16 = (Vec_Int_t *)malloc(0x10);
  pVVar16->nSize = 0;
  pVVar16->nCap = uVar24;
  if (uVar24 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar25 * 4);
  }
  pVVar16->pArray = piVar15;
  vNums = (Vec_Int_t *)malloc(0x10);
  vNums->nSize = 0;
  vNums->nCap = uVar24;
  if (uVar24 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar25 * 4);
  }
  vNums->pArray = piVar15;
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nSize = 0;
  vTemp->nCap = uVar24;
  if (uVar24 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar25 << 2);
  }
  vTemp->pArray = piVar15;
  Time[1][0] = 0;
  Time[1][1] = 0;
  Time[0][0] = 0;
  Time[0][1] = 0;
  fComplete[0] = 0;
  fComplete[1] = 0;
  local_a8 = pVVar16;
  if (fReverse == 0) {
    if (0 < nVars) {
      iVar7 = 3;
      do {
        Vec_IntPush(p,iVar7);
        iVar2 = iVar7 - nVars;
        iVar7 = iVar7 + 1;
      } while (iVar2 != 2);
    }
  }
  else if (0 < nVars) {
    do {
      Vec_IntPush(p,uVar20 + 1);
      uVar20 = uVar20 - 1;
    } while (1 < uVar20);
  }
  pVVar16 = local_a8;
  local_70 = (ABC_INT64_T)nBTLimit;
  iVar7 = 4;
  ppuVar21 = local_88;
  pcVar22 = " 0\n";
  bVar26 = true;
  local_78 = pSat;
LAB_005908b7:
  pLits[0] = iVar7;
  iVar7 = sat_solver_solve(local_78,pLits,pLits + 1,local_70,0,0,0);
  puVar12 = local_88[0];
  if (iVar7 == 0) {
    local_e4 = 0;
  }
  else {
    if (iVar7 != -1) goto code_r0x005908f6;
    local_88[0][1] = 0;
    uVar24 = 0;
    lVar25 = 0;
    while( true ) {
      cVar1 = pcVar22[lVar25];
      if (uVar24 == *puVar12) {
        if ((int)uVar24 < 0x10) {
          if (*(void **)(puVar12 + 2) == (void *)0x0) {
            pvVar13 = malloc(0x10);
          }
          else {
            pvVar13 = realloc(*(void **)(puVar12 + 2),0x10);
          }
          *(void **)(puVar12 + 2) = pvVar13;
          *puVar12 = 0x10;
        }
        else {
          uVar24 = uVar24 * 2;
          if (*(void **)(puVar12 + 2) == (void *)0x0) {
            pvVar13 = malloc((ulong)uVar24);
          }
          else {
            pvVar13 = realloc(*(void **)(puVar12 + 2),(ulong)uVar24);
          }
          *(void **)(puVar12 + 2) = pvVar13;
          *puVar12 = uVar24;
        }
      }
      else {
        pvVar13 = *(void **)(puVar12 + 2);
      }
      puVar6 = local_88[0];
      uVar24 = puVar12[1];
      puVar12[1] = uVar24 + 1;
      *(char *)((long)pvVar13 + (long)(int)uVar24) = cVar1;
      if (lVar25 == 2) break;
      uVar24 = puVar12[1];
      lVar25 = lVar25 + 1;
    }
    uVar24 = local_88[0][1];
    if (uVar24 == *local_88[0]) {
      if ((int)uVar24 < 0x10) {
        if (*(void **)(local_88[0] + 2) == (void *)0x0) {
          pvVar13 = malloc(0x10);
        }
        else {
          pvVar13 = realloc(*(void **)(local_88[0] + 2),0x10);
        }
        *(void **)(puVar6 + 2) = pvVar13;
        *puVar6 = 0x10;
      }
      else {
        sVar4 = (ulong)uVar24 * 2;
        if (*(void **)(local_88[0] + 2) == (void *)0x0) {
          pvVar13 = malloc(sVar4);
        }
        else {
          pvVar13 = realloc(*(void **)(local_88[0] + 2),sVar4);
        }
        *(void **)(puVar6 + 2) = pvVar13;
        *puVar6 = (uint)sVar4;
      }
    }
    else {
      pvVar13 = *(void **)(local_88[0] + 2);
    }
    uVar24 = puVar6[1];
    puVar6[1] = uVar24 + 1;
    *(undefined1 *)((long)pvVar13 + (long)(int)uVar24) = 0;
    fComplete[0] = 1;
    local_e4 = 0;
    pVVar16 = local_a8;
  }
  goto LAB_0059104d;
code_r0x005908f6:
  puVar12 = *ppuVar21;
  uVar24 = puVar12[1];
  if (uVar24 == *puVar12) {
    if ((int)uVar24 < 0x10) {
      if (*(void **)(puVar12 + 2) == (void *)0x0) {
        pvVar13 = malloc(0x10);
      }
      else {
        pvVar13 = realloc(*(void **)(puVar12 + 2),0x10);
      }
      *(void **)(puVar12 + 2) = pvVar13;
      *puVar12 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar24 * 2;
      if (*(void **)(puVar12 + 2) == (void *)0x0) {
        pvVar13 = malloc(sVar4);
      }
      else {
        pvVar13 = realloc(*(void **)(puVar12 + 2),sVar4);
      }
      *(void **)(puVar12 + 2) = pvVar13;
      *puVar12 = (uint)sVar4;
    }
  }
  else {
    pvVar13 = *(void **)(puVar12 + 2);
  }
  uVar24 = puVar12[1];
  puVar12[1] = uVar24 + 1;
  *(undefined1 *)((long)pvVar13 + (long)(int)uVar24) = 0;
  iVar7 = 5;
  pcVar22 = " 1\n";
  ppuVar21 = local_88 + 1;
  bVar5 = !bVar26;
  bVar26 = false;
  if (bVar5) goto code_r0x00590999;
  goto LAB_005908b7;
code_r0x00590999:
  local_e4 = 0;
  if (-1 < nCubeLim) {
    local_c0 = 0;
    local_e4 = 0;
    local_68 = uVar19;
    do {
      local_d8 = 0;
      do {
        if (fVerbose != 0) {
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            local_c0 = -1;
          }
          else {
            local_c0 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
        }
        pSat_00 = local_78;
        piVar15 = p->pArray;
        iVar7 = p->nSize;
        lVar25 = (long)iVar7;
        if (0 < lVar25) {
          lVar17 = 0;
          do {
            local_78->polarity[piVar15[lVar17]] = '\0';
            lVar17 = lVar17 + 1;
          } while (lVar25 != lVar17);
        }
        uVar24 = (uint)local_d8;
        pLits[0] = uVar24 | 4;
        iVar2 = *(int *)(&DAT_009f4900 + local_d8 * 4);
        pLits[1] = iVar2 * 2 + 1;
        iVar8 = sat_solver_solve(local_78,pLits,(lit *)&local_a8,0,0,0,0);
        if (fVerbose != 0) {
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar17 = -1;
          }
          else {
            lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Time[local_d8][0] = Time[local_d8][0] + (lVar17 - local_c0);
        }
        if (iVar8 == -1) {
LAB_00590ed2:
          fComplete[local_d8] = 1;
          break;
        }
        if (iVar8 == 0) goto LAB_0059104d;
        pVVar16->nSize = 0;
        if (0 < iVar7) {
          lVar17 = 0;
          do {
            iVar7 = piVar15[lVar17];
            if (((long)iVar7 < 0) || (pSat_00->size <= iVar7)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            Vec_IntPush(pVVar16,(uint)(pSat_00->model[iVar7] != 1) + iVar7 * 2);
            lVar17 = lVar17 + 1;
          } while (lVar25 != lVar17);
        }
        if (fVerbose == 0) {
          iVar7 = Bmc_CollapseExpand(pSat_00,(sat_solver *)0x0,pVVar16,vNums,vTemp,nBTLimit,
                                     (int)local_60,5 - uVar24);
        }
        else {
          iVar7 = clock_gettime(3,(timespec *)&ts);
          lVar25 = -1;
          local_c0 = -1;
          if (-1 < iVar7) {
            local_c0 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          iVar7 = Bmc_CollapseExpand(pSat_00,(sat_solver *)0x0,pVVar16,vNums,vTemp,nBTLimit,
                                     (int)local_60,5 - uVar24);
          iVar8 = clock_gettime(3,(timespec *)&ts);
          if (-1 < iVar8) {
            lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Time[local_d8][1] = Time[local_d8][1] + (lVar25 - local_c0);
        }
        if (iVar7 < 0) goto LAB_0059104d;
        puVar12 = local_88[local_d8];
        uVar24 = puVar12[1];
        if ((int)uVar24 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x249,"char Vec_StrPop(Vec_Str_t *)");
        }
        pvVar13 = *(void **)(puVar12 + 2);
        uVar10 = uVar24 - 1;
        puVar12[1] = uVar10;
        iVar7 = (int)uVar19;
        uVar23 = iVar7 + uVar24 + 3;
        uVar20 = uVar10;
        if ((int)uVar24 <= (int)uVar23) {
          uVar20 = *puVar12 * 2;
          uVar19 = (ulong)uVar23;
          if ((int)uVar20 < (int)uVar23) {
            uVar20 = uVar23;
            if (pvVar13 == (void *)0x0) {
              pvVar13 = malloc(uVar19);
            }
            else {
              pvVar13 = realloc(pvVar13,uVar19);
            }
LAB_00590cfe:
            *(void **)(puVar12 + 2) = pvVar13;
            *puVar12 = uVar20;
            uVar11 = puVar12[1];
          }
          else {
            uVar11 = uVar10;
            if ((int)*puVar12 < (int)uVar23) {
              if (pvVar13 == (void *)0x0) {
                pvVar13 = malloc((ulong)uVar20);
              }
              else {
                pvVar13 = realloc(pvVar13,(ulong)uVar20);
              }
              goto LAB_00590cfe;
            }
          }
          if ((int)uVar11 < (int)uVar23) {
            uVar18 = (ulong)(int)uVar11;
            do {
              *(undefined1 *)(*(long *)(puVar12 + 2) + uVar18) = 0x2d;
              uVar18 = uVar18 + 1;
            } while (uVar19 != uVar18);
          }
          puVar12[1] = uVar23;
          uVar20 = uVar23;
        }
        uVar23 = (iVar7 + uVar24) - 1;
        if (((int)uVar23 < 0) || ((int)uVar20 <= (int)uVar23)) {
LAB_00591306:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        uVar19 = (ulong)uVar23;
        *(undefined1 *)(*(long *)(puVar12 + 2) + uVar19) = 0x20;
        if ((int)puVar12[1] <= (int)(uVar24 + iVar7)) goto LAB_00591306;
        *(byte *)(*(long *)(puVar12 + 2) + (ulong)(uVar24 + iVar7)) = local_d8 == 0 | 0x30;
        if ((int)puVar12[1] <= (int)(uVar19 + 2)) goto LAB_00591306;
        local_70 = CONCAT44(local_70._4_4_,uVar23);
        *(undefined1 *)(*(long *)(puVar12 + 2) + uVar19 + 2) = 10;
        if ((int)puVar12[1] <= (int)(uVar19 + 3)) goto LAB_00591306;
        *(undefined1 *)(*(long *)(puVar12 + 2) + uVar19 + 3) = 0;
        vTemp->nSize = 0;
        Vec_IntPush(vTemp,iVar2 * 2);
        iVar7 = vNums->nSize;
        if (0 < (long)iVar7) {
          piVar15 = vNums->pArray;
          lVar25 = 0;
          do {
            uVar24 = piVar15[lVar25];
            if (((long)(int)uVar24 < 0) || (local_a8->nSize <= (int)uVar24)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar20 = local_a8->pArray[(int)uVar24];
            if ((int)uVar20 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            Vec_IntPush(vTemp,uVar20 ^ 1);
            if (fReverse == 0) {
              uVar24 = uVar24 + uVar10;
            }
            else {
              uVar24 = ~uVar24 + (int)local_70;
              if ((int)uVar24 < 0) goto LAB_00591306;
            }
            if ((int)puVar12[1] <= (int)uVar24) goto LAB_00591306;
            *(byte *)(*(long *)(puVar12 + 2) + (ulong)uVar24) = (byte)uVar20 & 1 ^ 0x31;
            lVar25 = lVar25 + 1;
          } while (iVar7 != lVar25);
        }
        iVar7 = sat_solver_addclause(local_78,vTemp->pArray,vTemp->pArray + vTemp->nSize);
        pVVar16 = local_a8;
        uVar19 = local_68;
        if (iVar7 != 1) {
          if (iVar7 != 0) {
            __assert_fail("status == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                          ,0x5d2,
                          "Vec_Str_t *Bmc_CollapseOne_int(sat_solver *, int, int, int, int, int, int)"
                         );
          }
          goto LAB_00590ed2;
        }
        bVar26 = local_d8 == 0;
        local_d8 = local_d8 + 1;
      } while (bVar26);
    } while ((fComplete[1] == 0 && fComplete[0] == 0) &&
            (local_e4 = local_e4 + 1, (int)local_e4 < nCubeLim || nCubeLim == 0));
  }
LAB_0059104d:
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  if (pVVar16->pArray != (int *)0x0) {
    free(pVVar16->pArray);
  }
  free(pVVar16);
  if (vNums->pArray != (int *)0x0) {
    free(vNums->pArray);
  }
  free(vNums);
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
  }
  free(vTemp);
  if (fComplete[1] != 0 && fComplete[0] != 0) {
    __assert_fail("!fComplete[0] || !fComplete[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x5dc,
                  "Vec_Str_t *Bmc_CollapseOne_int(sat_solver *, int, int, int, int, int, int)");
  }
  iVar7 = (int)uVar19;
  if (fComplete[0] == 0 && fComplete[1] == 0) {
    if (fVerbose == 0) {
      vSop = (Vec_Str_t *)0x0;
      goto LAB_00591273;
    }
    printf("Processed output with %d supp vars. ",uVar19 & 0xffffffff);
LAB_00591160:
    pcVar22 = "The resulting SOP exceeded %d cubes.\n";
    vSop = (Vec_Str_t *)0x0;
    uVar19 = (ulong)(uint)nCubeLim;
  }
  else {
    vSop = (Vec_Str_t *)local_88[fComplete[1]];
    local_88[fComplete[1]] = (uint *)0x0;
    if (1 < local_e4) {
      Bmc_CollapseIrredundantFull(vSop,vSop->nSize / (iVar7 + 3),iVar7);
    }
    if (fVerbose == 0) goto LAB_00591273;
    printf("Processed output with %d supp vars. ",uVar19 & 0xffffffff);
    if (vSop == (Vec_Str_t *)0x0) goto LAB_00591160;
    pcVar22 = "The best cover contains %d cubes.\n";
    uVar19 = (long)vSop->nSize / (long)(iVar7 + 3) & 0xffffffff;
  }
  printf(pcVar22,uVar19);
  dVar3 = (double)Time[0][0];
  iVar7 = (int)pcVar22;
  Abc_Print(iVar7,"%s =","Onset  minterm");
  Abc_Print(iVar7,"%9.2f sec\n",SUB84(dVar3 / 1000000.0,0));
  dVar3 = (double)Time[0][1];
  Abc_Print(iVar7,"%s =","Onset  expand ");
  Abc_Print(iVar7,"%9.2f sec\n",SUB84(dVar3 / 1000000.0,0));
  dVar3 = (double)Time[1][0];
  Abc_Print(iVar7,"%s =","Offset minterm");
  Abc_Print(iVar7,"%9.2f sec\n",SUB84(dVar3 / 1000000.0,0));
  dVar3 = (double)Time[1][1];
  Abc_Print(iVar7,"%s =","Offset expand ");
  Abc_Print(iVar7,"%9.2f sec\n",SUB84(dVar3 / 1000000.0,0));
LAB_00591273:
  puVar12 = local_88[0];
  if (local_88[0] != (uint *)0x0) {
    if (*(void **)(local_88[0] + 2) != (void *)0x0) {
      free(*(void **)(local_88[0] + 2));
    }
    free(puVar12);
  }
  puVar12 = local_88[1];
  if (local_88[1] != (uint *)0x0) {
    if (*(void **)((long)local_88[1] + 8) != (void *)0x0) {
      free(*(void **)((long)local_88[1] + 8));
    }
    free(puVar12);
  }
  return vSop;
}

Assistant:

Vec_Str_t * Bmc_CollapseOne_int( sat_solver * pSat, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    Vec_Str_t * vSop[2]   = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vVars = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars+1 );
    int n, v, iVar, pLits[2], iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};
    // variables
    int iOutVar    = 2;
    int iOOVars[2] = {0, 1};
//    int iOutVar    = 1;
//    int iOOVars[2] = {sat_solver_nvars(pSat) - 5, sat_solver_nvars(pSat) - 5 + 1};

    // collect CI variables (0 = onset enable, 1 = offset enable, 2 = output)
    int iCiVarBeg = 3;
//    int iCiVarBeg = sat_solver_nvars(pSat) - 5 - nVars;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        pLits[0] = Abc_Var2Lit( iOutVar, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat, pLits, pLits + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            sat_solver_clean_polarity( pSat, Vec_IntArray(vVars), Vec_IntSize(vVars) );
            pLits[0] = Abc_Var2Lit( iOutVar, n );    // set output
            pLits[1] = Abc_Var2Lit( iOOVars[n], 1 ); // enable clauses
            status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntForEachEntry( vVars, iVar, v )
                Vec_IntPush( vLits, Abc_Var2Lit(iVar, !sat_solver_var_value(pSat, iVar)) );
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
            status = Bmc_CollapseExpand( pSat, NULL, vLits, vNums, vCube, nBTLimit, fCanon, Abc_Var2Lit(iOutVar, !n) );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntPush( vCube, Abc_Var2Lit( iOOVars[n], 0 ) );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                int iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
            status = sat_solver_addclause( pSat, Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}